

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O3

void __thiscall
testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
Matcher(Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this,string *s)

{
  linked_ptr<const_testing::MatcherInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ptr;
  pointer pcVar1;
  undefined1 *local_88;
  long local_80;
  undefined1 local_78 [16];
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_68
  ;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  (this->
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).impl_.value_ =
       (MatcherInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  (this->
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).impl_.link_.next_ =
       &(this->
        super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ).impl_.link_;
  (this->
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  )._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00198828;
  pcVar1 = (s->_M_dataplus)._M_p;
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,pcVar1,pcVar1 + s->_M_string_length)
  ;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)local_50,local_88,local_88 + local_80);
  internal::ComparisonBase::operator_cast_to_Matcher(&local_68,(ComparisonBase *)local_50);
  ptr = &local_68.
         super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .impl_;
  internal::
  linked_ptr<const_testing::MatcherInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->
               super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ).impl_,ptr);
  local_68.
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00198b98;
  internal::
  linked_ptr<const_testing::MatcherInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~linked_ptr(ptr);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  return;
}

Assistant:

Matcher<internal::string>::Matcher(const internal::string& s) { *this = Eq(s); }